

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MauTools.cpp
# Opt level: O1

bool mau::SetCurrentThreadAffinity(uint processorIndex)

{
  int iVar1;
  pthread_t __th;
  cpu_set_t cpuset;
  cpu_set_t local_88;
  
  local_88.__bits[8] = 0;
  local_88.__bits[9] = 0;
  local_88.__bits[10] = 0;
  local_88.__bits[0xb] = 0;
  local_88.__bits[0xc] = 0;
  local_88.__bits[0xd] = 0;
  local_88.__bits[0xe] = 0;
  local_88.__bits[0xf] = 0;
  local_88.__bits[0] = 0;
  local_88.__bits[1] = 0;
  local_88.__bits[2] = 0;
  local_88.__bits[3] = 0;
  local_88.__bits[4] = 0;
  local_88.__bits[5] = 0;
  local_88.__bits[6] = 0;
  local_88.__bits[7] = 0;
  if (processorIndex < 0x400) {
    local_88.__bits[processorIndex >> 6] =
         local_88.__bits[processorIndex >> 6] | 1L << ((ulong)processorIndex & 0x3f);
  }
  __th = pthread_self();
  iVar1 = pthread_setaffinity_np(__th,0x80,&local_88);
  return iVar1 == 0;
}

Assistant:

bool SetCurrentThreadAffinity(unsigned processorIndex)
{
#ifdef _WIN32
    return 0 != ::SetThreadAffinityMask(
        ::GetCurrentThread(), (DWORD_PTR)1 << (processorIndex & 63));
#elif !defined(ANDROID)
    cpu_set_t cpuset;
    CPU_ZERO(&cpuset);
    CPU_SET(processorIndex, &cpuset);
    return 0 == pthread_setaffinity_np(pthread_self(),
        sizeof(cpu_set_t), &cpuset);
#else
    return true; // FIXME: Unused on Android anyway
#endif
}